

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O3

void __thiscall SQInstance::Release(SQInstance *this)

{
  SQRELEASEHOOK p_Var1;
  SQUnsignedInteger SVar2;
  
  SVar2 = (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  p_Var1 = this->_hook;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = SVar2 + 1;
  if (p_Var1 != (SQRELEASEHOOK)0x0) {
    (*p_Var1)(this->_userpointer,0);
    SVar2 = (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef - 1;
  }
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = SVar2;
  if (SVar2 != 0) {
    return;
  }
  SVar2 = this->_memsize;
  (**(this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_vm_free(this,SVar2);
  return;
}

Assistant:

void Release() {
        _uiRef++;
        if (_hook) { _hook(_userpointer,0);}
        _uiRef--;
        if(_uiRef > 0) return;
        SQInteger size = _memsize;
        this->~SQInstance();
        SQ_FREE(this, size);
    }